

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O1

void __thiscall Bipartition::complement(Bipartition *this,size_t numLeaves)

{
  ulong *puVar1;
  pointer puVar2;
  ulong uVar3;
  
  if (numLeaves != 0) {
    uVar3 = (this->partition).m_num_bits;
    puVar2 = (this->partition).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar3 = uVar3 - 1;
      puVar1 = puVar2 + (uVar3 >> 6);
      *puVar1 = *puVar1 ^ 1L << ((byte)uVar3 & 0x3f);
      numLeaves = numLeaves - 1;
    } while (numLeaves != 0);
  }
  return;
}

Assistant:

void Bipartition::complement(size_t numLeaves) {
    size_t s = size();
    for (size_t i = 0; i < numLeaves; ++i) {
        partition[s - i - 1].flip();
    }
}